

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O0

Type * __thiscall Expr::DataType(Expr *this,Env *env)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  TypeType TVar4;
  Type *pTVar5;
  ID *pIVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Object *o;
  Exception *this_00;
  string *msg;
  reference ppCVar7;
  reference ppCVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  Expr *in_RSI;
  long in_RDI;
  int contender;
  int largest;
  Type *type2_1;
  iterator i;
  Type *numeric_with_largest_width;
  Type *type1_1;
  Type *type2;
  Type *type1;
  Type *parent_type_1;
  Type *parent_type;
  Type *data_type;
  vector<CaseExpr_*,_std::allocator<CaseExpr_*>_> *in_stack_fffffffffffffe58;
  ID *in_stack_fffffffffffffe60;
  Env *in_stack_fffffffffffffe68;
  vector<CaseExpr_*,_std::allocator<CaseExpr_*>_> *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe80;
  Object *in_stack_fffffffffffffe88;
  Exception *in_stack_fffffffffffffe90;
  int local_14c;
  int local_148;
  undefined1 local_140 [32];
  Type *in_stack_fffffffffffffee0;
  Type *in_stack_fffffffffffffee8;
  char local_100 [32];
  ExternType *local_e0;
  CaseExpr **local_d8;
  __normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_> local_d0;
  ExternType *local_c8;
  ExternType *local_c0;
  undefined1 local_b1;
  undefined1 local_b0 [8];
  undefined1 local_80 [32];
  char local_60 [32];
  Type *local_40;
  ExternType *local_38;
  Type *local_30;
  Type *local_28;
  Env *in_stack_ffffffffffffffe0;
  ExternType *local_8;
  
  switch(*(undefined4 *)(in_RDI + 0x58)) {
  case 0:
    local_8 = (ExternType *)Env::GetDataType(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    break;
  case 1:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
    local_8 = extern_type_int;
    break;
  default:
    local_8 = (ExternType *)0x0;
    break;
  case 4:
    local_30 = DataType(in_RSI,in_stack_ffffffffffffffe0);
    iVar2 = (*(local_30->super_DataDepElement)._vptr_DataDepElement[0xe])();
    local_8 = (ExternType *)CONCAT44(extraout_var_00,iVar2);
    break;
  case 5:
    pTVar5 = DataType(in_RSI,in_stack_ffffffffffffffe0);
    if (pTVar5 == (Type *)0x0) {
      local_8 = (ExternType *)0x0;
    }
    else {
      local_28 = pTVar5;
      pIVar6 = id(*(Expr **)(in_RDI + 0x68));
      iVar2 = (*(pTVar5->super_DataDepElement)._vptr_DataDepElement[0xd])(pTVar5,pIVar6);
      local_8 = (ExternType *)CONCAT44(extraout_var,iVar2);
    }
    break;
  case 6:
    local_8 = (ExternType *)DataType(in_RSI,in_stack_ffffffffffffffe0);
    break;
  case 7:
    local_8 = (ExternType *)DataType(in_RSI,in_stack_ffffffffffffffe0);
    break;
  case 0x20:
    local_38 = (ExternType *)DataType(in_RSI,in_stack_ffffffffffffffe0);
    local_40 = DataType(in_RSI,in_stack_ffffffffffffffe0);
    bVar1 = Type::CompatibleTypes(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    local_8 = local_38;
    if (!bVar1) {
      local_b1 = 1;
      o = (Object *)__cxa_allocate_exception(0x20);
      this_00 = (Exception *)(in_RDI + 0x10);
      (*(local_38->super_Type).super_DataDepElement._vptr_DataDepElement[0xb])(local_80);
      msg = (string *)std::__cxx11::string::c_str();
      (*(local_40->super_DataDepElement)._vptr_DataDepElement[0xb])(local_b0);
      uVar9 = std::__cxx11::string::c_str();
      strfmt_abi_cxx11_(local_60,"type mismatch: %s vs %s",msg,uVar9);
      Exception::Exception(this_00,o,msg);
      local_b1 = 0;
      __cxa_throw(o,&Exception::typeinfo,Exception::~Exception);
    }
    break;
  case 0x21:
    if ((*(long *)(in_RDI + 0xa0) == 0) ||
       (bVar1 = std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>::empty
                          (in_stack_fffffffffffffe70), bVar1)) {
      local_8 = (ExternType *)0x0;
    }
    else {
      ppCVar7 = std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>::front
                          ((vector<CaseExpr_*,_std::allocator<CaseExpr_*>_> *)
                           in_stack_fffffffffffffe60);
      CaseExpr::value(*ppCVar7);
      local_c0 = (ExternType *)DataType(in_RSI,in_stack_ffffffffffffffe0);
      local_c8 = (ExternType *)0x0;
      if (*(long *)(in_RDI + 0xa0) != 0) {
        local_d0._M_current =
             (CaseExpr **)
             std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>::begin(in_stack_fffffffffffffe58);
        while( true ) {
          local_d8 = (CaseExpr **)
                     std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>::end
                               (in_stack_fffffffffffffe58);
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>
                              *)in_stack_fffffffffffffe60,
                             (__normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>
                              *)in_stack_fffffffffffffe58);
          if (!bVar1) break;
          ppCVar8 = __gnu_cxx::
                    __normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>
                    ::operator*(&local_d0);
          CaseExpr::value(*ppCVar8);
          local_e0 = (ExternType *)DataType(in_RSI,in_stack_ffffffffffffffe0);
          bVar1 = Type::CompatibleTypes(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
          if (!bVar1) {
            uVar9 = __cxa_allocate_exception(0x20);
            (*(local_c0->super_Type).super_DataDepElement._vptr_DataDepElement[0xb])
                      (&stack0xfffffffffffffee0);
            uVar10 = std::__cxx11::string::c_str();
            (*(local_e0->super_Type).super_DataDepElement._vptr_DataDepElement[0xb])(local_140);
            uVar11 = std::__cxx11::string::c_str();
            strfmt_abi_cxx11_(local_100,"type mismatch: %s vs %s",uVar10,uVar11);
            Exception::Exception
                      (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80
                      );
            __cxa_throw(uVar9,&Exception::typeinfo,Exception::~Exception);
          }
          if (local_c0 == extern_type_nullptr) {
            local_c0 = local_e0;
          }
          if ((local_e0 != (ExternType *)0x0) &&
             (uVar3 = (*(local_e0->super_Type).super_DataDepElement._vptr_DataDepElement[0x11])(),
             (uVar3 & 1) != 0)) {
            if (local_c8 == (ExternType *)0x0) {
              local_c8 = local_e0;
            }
            else {
              TVar4 = Type::tot(&local_c8->super_Type);
              if (TVar4 == EXTERN) {
                local_148 = 4;
              }
              else {
                local_148 = (*(local_c8->super_Type).super_DataDepElement._vptr_DataDepElement[0x13]
                            )(local_c8,in_RSI);
              }
              TVar4 = Type::tot(&local_e0->super_Type);
              if (TVar4 == EXTERN) {
                local_14c = 4;
              }
              else {
                local_14c = (*(local_e0->super_Type).super_DataDepElement._vptr_DataDepElement[0x13]
                            )(local_e0,in_RSI);
              }
              if (local_148 < local_14c) {
                local_c8 = local_e0;
              }
            }
          }
          __gnu_cxx::
          __normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>::
          operator++(&local_d0);
        }
      }
      local_8 = local_c0;
      if (local_c8 != (ExternType *)0x0) {
        local_8 = local_c8;
      }
    }
  }
  return &local_8->super_Type;
}

Assistant:

Type* Expr::DataType(Env* env) const
	{
	Type* data_type;

	switch ( expr_type_ )
		{
		case EXPR_ID:
			data_type = env->GetDataType(id_);
			break;

		case EXPR_MEMBER:
			{
			// Get type of the parent
			Type* parent_type = operand_[0]->DataType(env);
			if ( ! parent_type )
				return nullptr;
			data_type = parent_type->MemberDataType(operand_[1]->id());
			}
			break;

		case EXPR_SUBSCRIPT:
			{
			// Get type of the parent
			Type* parent_type = operand_[0]->DataType(env);
			data_type = parent_type->ElementDataType();
			}
			break;

		case EXPR_PAREN:
			data_type = operand_[0]->DataType(env);
			break;

		case EXPR_COND:
			{
			Type* type1 = operand_[1]->DataType(env);
			Type* type2 = operand_[2]->DataType(env);
			if ( ! Type::CompatibleTypes(type1, type2) )
				{
				throw Exception(this,
				                strfmt("type mismatch: %s vs %s", type1->DataTypeStr().c_str(),
				                       type2->DataTypeStr().c_str()));
				}
			data_type = type1;
			}
			break;

		case EXPR_CALL:
			data_type = operand_[0]->DataType(env);
			break;

		case EXPR_CASE:
			{
			if ( cases_ && ! cases_->empty() )
				{
				Type* type1 = cases_->front()->value()->DataType(env);
				Type* numeric_with_largest_width = nullptr;

				foreach (i, CaseExprList, cases_)
					{
					Type* type2 = (*i)->value()->DataType(env);
					if ( ! Type::CompatibleTypes(type1, type2) )
						{
						throw Exception(this, strfmt("type mismatch: %s vs %s",
						                             type1->DataTypeStr().c_str(),
						                             type2->DataTypeStr().c_str()));
						}
					if ( type1 == extern_type_nullptr )
						type1 = type2;

					if ( type2 && type2->IsNumericType() )
						{
						if ( numeric_with_largest_width )
							{
							int largest;
							int contender;

							// External C++ types like "int", "bool", "enum" use "int"
							// storage internally.
							if ( numeric_with_largest_width->tot() == Type::EXTERN )
								largest = sizeof(int);
							else
								largest = numeric_with_largest_width->StaticSize(env);

							if ( type2->tot() == Type::EXTERN )
								contender = sizeof(int);
							else
								contender = type2->StaticSize(env);

							if ( contender > largest )
								numeric_with_largest_width = type2;
							}
						else
							numeric_with_largest_width = type2;
						}
					}
				data_type = numeric_with_largest_width ? numeric_with_largest_width : type1;
				}
			else
				data_type = nullptr;
			}
			break;

		case EXPR_NUM:
		case EXPR_SIZEOF:
		case EXPR_OFFSETOF:
		case EXPR_NEG:
		case EXPR_PLUS:
		case EXPR_MINUS:
		case EXPR_TIMES:
		case EXPR_DIV:
		case EXPR_MOD:
		case EXPR_BITNOT:
		case EXPR_BITAND:
		case EXPR_BITOR:
		case EXPR_BITXOR:
		case EXPR_LSHIFT:
		case EXPR_RSHIFT:
		case EXPR_EQUAL:
		case EXPR_GE:
		case EXPR_LE:
		case EXPR_GT:
		case EXPR_LT:
		case EXPR_NOT:
		case EXPR_AND:
		case EXPR_OR:
			data_type = extern_type_int;
			break;

		default:
			data_type = nullptr;
			break;
		}

	return data_type;
	}